

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_17(LParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar2;
  shared_ptr<LNode> local_d0;
  shared_ptr<LNode> local_c0;
  LNodeEStmt local_b0;
  undefined1 local_8c [12];
  shared_ptr<LNodeData<LNodeEStmt>_> estmt;
  shared_ptr<LNode> expr;
  shared_ptr<LNode> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<LNode> vars;
  shared_ptr<LNode> var;
  LParser *this_local;
  
  get_node((LParser *)&vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_ESI
          );
  get_node((LParser *)local_38,in_ESI);
  std::shared_ptr<LNode>::shared_ptr
            ((shared_ptr<LNode> *)
             &expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<LNode> *)local_38);
  lnode_get<LNodeChildren>(local_58);
  peVar1 = std::
           __shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<LNodeData<LNodeChildren>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  LNodeChildren::push_front
            (&peVar1->value,
             (shared_ptr<LNode> *)
             &vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNodeData<LNodeChildren>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeChildren>_> *)local_58);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &expr.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  get_node((LParser *)
           &estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  local_8c._0_4_ = 0x27;
  std::shared_ptr<LNode>::shared_ptr(&local_c0,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::shared_ptr
            (&local_d0,
             (shared_ptr<LNode> *)
             &estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  LNodeEStmt::LNodeEStmt(&local_b0,&local_c0,&local_d0);
  std::make_shared<LNodeData<LNodeEStmt>,LNodeType,LNodeEStmt>
            ((LNodeType *)(local_8c + 4),(LNodeEStmt *)local_8c);
  LNodeEStmt::~LNodeEStmt(&local_b0);
  std::shared_ptr<LNode>::~shared_ptr(&local_d0);
  std::shared_ptr<LNode>::~shared_ptr(&local_c0);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeEStmt>,void>
            ((shared_ptr<LNode> *)this,(shared_ptr<LNodeData<LNodeEStmt>_> *)(local_8c + 4));
  std::shared_ptr<LNodeData<LNodeEStmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeEStmt>_> *)(local_8c + 4));
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &estmt.super___shared_ptr<LNodeData<LNodeEStmt>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &vars.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar2.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_17() {
    // EStmt : Var Vars EQUAL Expr BR Brs
    auto var = this->get_node(6);
    auto vars = this->get_node(5);
    lnode_get<LNodeChildren>(vars)->value.push_front(std::move(var));
    auto expr = this->get_node(3);
    auto estmt = std::make_shared<LNodeData<LNodeEStmt>>(LNodeType::EStmt, LNodeEStmt(vars, expr));
    return estmt;
}